

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

locale __thiscall
booster::locale::impl_std::create_formatting
          (impl_std *this,locale *in,string *locale_name,character_facet_type type,utf8_support utf)

{
  utf8_time_put_from_wide *__f;
  utf8_numpunct_from_wide *puVar1;
  utf8_moneypunct_from_wide<true> *puVar2;
  utf8_moneypunct_from_wide<false> *puVar3;
  base_num_format<char> *pbVar4;
  base_num_format<wchar_t> *__f_00;
  time_put_from_base<char> *ptVar5;
  utf8_numpunct *__f_01;
  utf8_moneypunct<true> *__f_02;
  utf8_moneypunct<false> *__f_03;
  locale *tmp_3;
  locale tmp;
  locale base;
  locale lStack_38;
  locale local_30;
  locale local_28;
  
  if (type == 2) {
    create_basic_formatting<wchar_t>(this,in,locale_name);
    __f_00 = (base_num_format<wchar_t> *)operator_new(0x10);
    *(undefined4 *)&__f_00->field_0x8 = 0;
    *(undefined ***)__f_00 = &PTR__facet_001d2240;
    std::locale::locale<booster::locale::util::base_num_format<wchar_t>>
              (&local_30,(locale *)this,__f_00);
LAB_001a3455:
    std::locale::operator=((locale *)this,&local_30);
  }
  else {
    if (type != 1) {
      std::locale::locale((locale *)this,in);
      return (locale)(_Impl *)this;
    }
    if (utf == utf8_native) {
      std::locale::locale(&local_30,(locale_name->_M_dataplus)._M_p);
      ptVar5 = (time_put_from_base<char> *)operator_new(0x18);
      *(undefined4 *)&ptVar5->field_0x8 = 0;
      *(undefined ***)ptVar5 = &PTR__time_put_from_base_001d20c0;
      std::locale::locale(&ptVar5->base_,&local_30);
      std::locale::locale<booster::locale::impl_std::time_put_from_base<char>>(&lStack_38,in,ptVar5)
      ;
      __f_01 = (utf8_numpunct *)operator_new(0x18);
      std::__cxx11::numpunct_byname<char>::numpunct_byname
                ((char *)__f_01,(ulong)(locale_name->_M_dataplus)._M_p);
      *(undefined ***)__f_01 = &PTR__numpunct_001d1ef8;
      std::locale::locale<booster::locale::impl_std::utf8_numpunct>(&local_28,&lStack_38,__f_01);
      std::locale::operator=(&lStack_38,&local_28);
      std::locale::~locale(&local_28);
      __f_02 = (utf8_moneypunct<true> *)operator_new(0x18);
      std::__cxx11::moneypunct_byname<char,true>::moneypunct_byname
                ((char *)__f_02,(ulong)(locale_name->_M_dataplus)._M_p);
      *(undefined ***)__f_02 = &PTR__moneypunct_001d2100;
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct<true>>
                (&local_28,&lStack_38,__f_02);
      std::locale::operator=(&lStack_38,&local_28);
      std::locale::~locale(&local_28);
      __f_03 = (utf8_moneypunct<false> *)operator_new(0x18);
      std::__cxx11::moneypunct_byname<char,false>::moneypunct_byname
                ((char *)__f_03,(ulong)(locale_name->_M_dataplus)._M_p);
      *(undefined ***)__f_03 = &PTR__moneypunct_001d2180;
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct<false>>
                (&local_28,&lStack_38,__f_03);
      std::locale::operator=(&lStack_38,&local_28);
      std::locale::~locale(&local_28);
      pbVar4 = (base_num_format<char> *)operator_new(0x10);
      *(undefined4 *)&pbVar4->field_0x8 = 0;
      *(undefined ***)pbVar4 = &PTR__facet_001d2058;
      std::locale::locale<booster::locale::util::base_num_format<char>>
                ((locale *)this,&lStack_38,pbVar4);
    }
    else if (utf == utf8_native_with_wide) {
      std::locale::locale(&local_30,(locale_name->_M_dataplus)._M_p);
      ptVar5 = (time_put_from_base<char> *)operator_new(0x18);
      *(undefined4 *)&ptVar5->field_0x8 = 0;
      *(undefined ***)ptVar5 = &PTR__time_put_from_base_001d20c0;
      std::locale::locale(&ptVar5->base_,&local_30);
      std::locale::locale<booster::locale::impl_std::time_put_from_base<char>>(&lStack_38,in,ptVar5)
      ;
      puVar1 = (utf8_numpunct_from_wide *)operator_new(0x80);
      utf8_numpunct_from_wide::utf8_numpunct_from_wide(puVar1,&local_30,0);
      std::locale::locale<booster::locale::impl_std::utf8_numpunct_from_wide>
                (&local_28,&lStack_38,puVar1);
      std::locale::operator=(&lStack_38,&local_28);
      std::locale::~locale(&local_28);
      puVar2 = (utf8_moneypunct_from_wide<true> *)operator_new(0xb0);
      utf8_moneypunct_from_wide<true>::utf8_moneypunct_from_wide(puVar2,&local_30,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<true>>
                (&local_28,&lStack_38,puVar2);
      std::locale::operator=(&lStack_38,&local_28);
      std::locale::~locale(&local_28);
      puVar3 = (utf8_moneypunct_from_wide<false> *)operator_new(0xb0);
      utf8_moneypunct_from_wide<false>::utf8_moneypunct_from_wide(puVar3,&local_30,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<false>>
                (&local_28,&lStack_38,puVar3);
      std::locale::operator=(&lStack_38,&local_28);
      std::locale::~locale(&local_28);
      pbVar4 = (base_num_format<char> *)operator_new(0x10);
      *(undefined4 *)&pbVar4->field_0x8 = 0;
      *(undefined ***)pbVar4 = &PTR__facet_001d2058;
      std::locale::locale<booster::locale::util::base_num_format<char>>
                ((locale *)this,&lStack_38,pbVar4);
    }
    else {
      if (utf != utf8_from_wide) {
        create_basic_formatting<char>(this,in,locale_name);
        pbVar4 = (base_num_format<char> *)operator_new(0x10);
        *(undefined4 *)&pbVar4->field_0x8 = 0;
        *(undefined ***)pbVar4 = &PTR__facet_001d2058;
        std::locale::locale<booster::locale::util::base_num_format<char>>
                  (&local_30,(locale *)this,pbVar4);
        goto LAB_001a3455;
      }
      std::locale::locale(&local_30,(locale_name->_M_dataplus)._M_p);
      __f = (utf8_time_put_from_wide *)operator_new(0x18);
      *(undefined4 *)&__f->field_0x8 = 0;
      *(undefined ***)__f = &PTR__utf8_time_put_from_wide_001d1e58;
      std::locale::locale(&__f->base_,&local_30);
      std::locale::locale<booster::locale::impl_std::utf8_time_put_from_wide>(&lStack_38,in,__f);
      puVar1 = (utf8_numpunct_from_wide *)operator_new(0x80);
      utf8_numpunct_from_wide::utf8_numpunct_from_wide(puVar1,&local_30,0);
      std::locale::locale<booster::locale::impl_std::utf8_numpunct_from_wide>
                (&local_28,&lStack_38,puVar1);
      std::locale::operator=(&lStack_38,&local_28);
      std::locale::~locale(&local_28);
      puVar2 = (utf8_moneypunct_from_wide<true> *)operator_new(0xb0);
      utf8_moneypunct_from_wide<true>::utf8_moneypunct_from_wide(puVar2,&local_30,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<true>>
                (&local_28,&lStack_38,puVar2);
      std::locale::operator=(&lStack_38,&local_28);
      std::locale::~locale(&local_28);
      puVar3 = (utf8_moneypunct_from_wide<false> *)operator_new(0xb0);
      utf8_moneypunct_from_wide<false>::utf8_moneypunct_from_wide(puVar3,&local_30,0);
      std::locale::locale<booster::locale::impl_std::utf8_moneypunct_from_wide<false>>
                (&local_28,&lStack_38,puVar3);
      std::locale::operator=(&lStack_38,&local_28);
      std::locale::~locale(&local_28);
      pbVar4 = (base_num_format<char> *)operator_new(0x10);
      *(undefined4 *)&pbVar4->field_0x8 = 0;
      *(undefined ***)pbVar4 = &PTR__facet_001d2058;
      std::locale::locale<booster::locale::util::base_num_format<char>>
                ((locale *)this,&lStack_38,pbVar4);
    }
    std::locale::~locale(&lStack_38);
  }
  std::locale::~locale(&local_30);
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_formatting(  std::locale const &in,
                                std::string const &locale_name,
                                character_facet_type type,
                                utf8_support utf)
{
        switch(type) {
        case char_facet: 
            {
                if(utf == utf8_from_wide ) {
                    std::locale base = std::locale(locale_name.c_str());
                    
                    std::locale tmp = std::locale(in,new utf8_time_put_from_wide(base));
                    tmp = std::locale(tmp,new utf8_numpunct_from_wide(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<true>(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<false>(base));
                    return std::locale(tmp,new util::base_num_format<char>());
                }
                else if(utf == utf8_native) {
                    std::locale base = std::locale(locale_name.c_str());

                    std::locale tmp = std::locale(in,new time_put_from_base<char>(base));
                    tmp = std::locale(tmp,new utf8_numpunct(locale_name.c_str()));
                    tmp = std::locale(tmp,new utf8_moneypunct<true>(locale_name.c_str()));
                    tmp = std::locale(tmp,new utf8_moneypunct<false>(locale_name.c_str()));
                    return std::locale(tmp,new util::base_num_format<char>());
                }
                else if(utf == utf8_native_with_wide) {
                    std::locale base = std::locale(locale_name.c_str());

                    std::locale tmp = std::locale(in,new time_put_from_base<char>(base));
                    tmp = std::locale(tmp,new utf8_numpunct_from_wide(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<true>(base));
                    tmp = std::locale(tmp,new utf8_moneypunct_from_wide<false>(base));
                    return std::locale(tmp,new util::base_num_format<char>());
                }
                else
                {
                    std::locale tmp = create_basic_formatting<char>(in,locale_name);
                    tmp = std::locale(tmp,new util::base_num_format<char>());
                    return tmp;
                }
            }
        case wchar_t_facet:
            {
                std::locale tmp = create_basic_formatting<wchar_t>(in,locale_name);
                tmp = std::locale(tmp,new util::base_num_format<wchar_t>());
                return tmp;
            }
        #ifdef BOOSTER_HAS_CHAR16_T
        case char16_t_facet:
            {
                std::locale tmp = create_basic_formatting<char16_t>(in,locale_name);
                tmp = std::locale(tmp,new util::base_num_format<char16_t>());
                return tmp;
            }
        #endif
        #ifdef BOOSTER_HAS_CHAR32_T
        case char32_t_facet:
            {
                std::locale tmp = create_basic_formatting<char32_t>(in,locale_name);
                tmp = std::locale(tmp,new util::base_num_format<char32_t>());
                return tmp;
            }
        #endif
        default:
            return in;
        }
}